

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O1

Binary * __thiscall i2p::sam::Session::MyDestination(Binary *__return_storage_ptr__,Session *this)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  ulong uVar1;
  runtime_error *prVar2;
  unsigned_long *in_R8;
  unsigned_long *in_R9;
  long in_FS_OFFSET;
  size_t dest_len;
  uint16_t cert_len;
  unsigned_long local_60;
  ulong local_58;
  ushort local_4a;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __first._M_current =
       (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  uVar1 = (long)(this->m_private_key).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)__first._M_current;
  if (uVar1 < 0x183) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_58 = (long)(this->m_private_key).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_private_key).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_60 = 0x183;
    tinyformat::format<unsigned_long,unsigned_long>
              (&local_48,(tinyformat *)"The private key is too short (%d < %d)",(char *)&local_58,
               &local_60,in_R8);
    std::runtime_error::runtime_error(prVar2,(string *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    local_4a = *(ushort *)(__first._M_current + 0x181) << 8 |
               *(ushort *)(__first._M_current + 0x181) >> 8;
    local_58 = (ulong)local_4a + 0x183;
    if (uVar1 < local_58) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_60 = (long)(this->m_private_key).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_private_key).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      tinyformat::format<unsigned_short,unsigned_long,unsigned_long>
                (&local_48,
                 (tinyformat *)
                 "Certificate length (%d) designates that the private key should be %d bytes, but it is only %d bytes"
                 ,(char *)&local_4a,(unsigned_short *)&local_58,&local_60,in_R9);
      std::runtime_error::runtime_error(prVar2,(string *)&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 __first,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(__first._M_current + local_58),(allocator_type *)&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Binary Session::MyDestination() const
{
    // From https://geti2p.net/spec/common-structures#destination:
    // "They are 387 bytes plus the certificate length specified at bytes 385-386, which may be
    // non-zero"
    static constexpr size_t DEST_LEN_BASE = 387;
    static constexpr size_t CERT_LEN_POS = 385;

    uint16_t cert_len;

    if (m_private_key.size() < CERT_LEN_POS + sizeof(cert_len)) {
        throw std::runtime_error(strprintf("The private key is too short (%d < %d)",
                                           m_private_key.size(),
                                           CERT_LEN_POS + sizeof(cert_len)));
    }

    memcpy(&cert_len, &m_private_key.at(CERT_LEN_POS), sizeof(cert_len));
    cert_len = be16toh_internal(cert_len);

    const size_t dest_len = DEST_LEN_BASE + cert_len;

    if (dest_len > m_private_key.size()) {
        throw std::runtime_error(strprintf("Certificate length (%d) designates that the private key should "
                                           "be %d bytes, but it is only %d bytes",
                                           cert_len,
                                           dest_len,
                                           m_private_key.size()));
    }

    return Binary{m_private_key.begin(), m_private_key.begin() + dest_len};
}